

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O2

future<rlottie::Surface> __thiscall
AnimationImpl::renderAsync(AnimationImpl *this,size_t frameNo,Surface *surface,bool keepAspectRatio)

{
  __shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  RenderTaskScheduler *task;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined1 in_R8B;
  future<rlottie::Surface> fVar10;
  promise<rlottie::Surface> local_58;
  __shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  puVar2 = (undefined8 *)CONCAT71(in_register_00000009,keepAspectRatio);
  this_00 = (__shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2> *)(frameNo + 0x20);
  if (*(long *)(frameNo + 0x20) == 0) {
    std::make_shared<RenderTask>();
    std::__shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,(__shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
  }
  else {
    std::promise<rlottie::Surface>::promise(&local_58);
    std::promise<rlottie::Surface>::operator=(&this_00->_M_ptr->sender,&local_58);
    std::promise<rlottie::Surface>::~promise(&local_58);
    std::__basic_future<rlottie::Surface>::__basic_future
              ((__basic_future<rlottie::Surface> *)&local_58,(__state_type *)this_00->_M_ptr);
    std::future<rlottie::Surface>::operator=
              (&this_00->_M_ptr->receiver,(future<rlottie::Surface> *)&local_58);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58._M_future.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  lVar1 = *(long *)(frameNo + 0x20);
  *(size_t *)(lVar1 + 0x28) = frameNo;
  *(Surface **)(lVar1 + 0x30) = surface;
  uVar3 = puVar2[1];
  uVar4 = puVar2[2];
  uVar5 = puVar2[3];
  uVar6 = puVar2[4];
  uVar7 = puVar2[5];
  uVar8 = puVar2[6];
  uVar9 = puVar2[7];
  *(undefined8 *)(lVar1 + 0x38) = *puVar2;
  *(undefined8 *)(lVar1 + 0x40) = uVar3;
  *(undefined8 *)(lVar1 + 0x48) = uVar4;
  *(undefined8 *)(lVar1 + 0x50) = uVar5;
  *(undefined8 *)(lVar1 + 0x58) = uVar6;
  *(undefined8 *)(lVar1 + 0x60) = uVar7;
  *(undefined8 *)(lVar1 + 0x68) = uVar8;
  *(undefined8 *)(lVar1 + 0x70) = uVar9;
  *(undefined1 *)(*(long *)(frameNo + 0x20) + 0x78) = in_R8B;
  task = RenderTaskScheduler::instance();
  std::__shared_ptr<RenderTask,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_40,this_00);
  RenderTaskScheduler::process((RenderTaskScheduler *)this,(SharedRenderTask *)task);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  fVar10.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar10.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (future<rlottie::Surface>)
         fVar10.super___basic_future<rlottie::Surface>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<Surface> AnimationImpl::renderAsync(size_t    frameNo,
                                                Surface &&surface,
                                                bool      keepAspectRatio)
{
    if (!mTask) {
        mTask = std::make_shared<RenderTask>();
    } else {
        mTask->sender = std::promise<Surface>();
        mTask->receiver = mTask->sender.get_future();
    }
    mTask->playerImpl = this;
    mTask->frameNo = frameNo;
    mTask->surface = std::move(surface);
    mTask->keepAspectRatio = keepAspectRatio;

    return RenderTaskScheduler::instance().process(mTask);
}